

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O2

string * __thiscall
LumaQuantizer::name_abi_cxx11_(string *__return_storage_ptr__,LumaQuantizer *this,ptf_t ptf)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string LumaQuantizer::name(ptf_t ptf)
{
    std::string name;
    switch (ptf)
    {
    case PTF_PQ:
        name = "Perceptual quantizer (PQ, SMPTE ST 2084)";
        break;
    case PTF_LOG:
        name = "Logarithmic";
        break;
    case PTF_JND_HDRVDP:
        name = "JND HDR-VDP";
        break;
    case PTF_PSI:
        name = "Perceptual - Ferwerda's t.v.i.";
        break;
    case PTF_LINEAR:
        name = "Linear scaling";
        break;
    default:
        name = "Undefined";
    }
    
    return name;
}